

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject * luaC_newobj(lua_State *L,lu_byte tt,size_t sz)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  
  pgVar1 = L->l_G;
  pGVar2 = (GCObject *)luaM_malloc_(L,sz,tt & 0xf);
  pGVar2->marked = pgVar1->currentwhite & 0x18;
  pGVar2->tt = tt;
  pGVar2->next = pgVar1->allgc;
  pgVar1->allgc = pGVar2;
  return pGVar2;
}

Assistant:

GCObject *luaC_newobj (lua_State *L, lu_byte tt, size_t sz) {
  return luaC_newobjdt(L, tt, sz, 0);
}